

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O2

void __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::dump
          (DWARFListTableBase<llvm::DWARFDebugRnglist> *this,raw_ostream *OS,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
          LookupPooledAddress,DIDumpOptions DumpOpts)

{
  _Base_ptr p_Var1;
  RangeListEntry *pRVar2;
  function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)> LookupPooledAddress_00
  ;
  raw_ostream *this_00;
  _Rb_tree_node_base *p_Var3;
  RangeListEntry *Entry;
  _Base_ptr p_Var4;
  RangeListEntry *Entry_1;
  ulong uVar5;
  RangeListEntry *this_01;
  StringRef SVar6;
  uint64_t local_78;
  uint64_t CurrentBase;
  intptr_t iStack_68;
  intptr_t local_60;
  _func_Optional<llvm::object::SectionedAddress>_intptr_t_uint *local_58;
  raw_ostream *local_50;
  _Rb_tree_node_base *local_48;
  _Base_ptr local_40;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *local_38;
  
  local_60 = LookupPooledAddress.callable;
  local_58 = LookupPooledAddress.callback;
  DWARFListTableHeader::dump(&this->Header,OS,DumpOpts);
  local_50 = OS;
  this_00 = raw_ostream::operator<<(OS,this->HeaderString);
  raw_ostream::operator<<(this_00,"\n");
  local_38 = this;
  if (DumpOpts.Verbose == true) {
    uVar5 = 0;
    for (p_Var3 = (this->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->ListMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      p_Var1 = p_Var3[1]._M_left;
      for (p_Var4 = p_Var3[1]._M_parent; p_Var4 != p_Var1; p_Var4 = (_Base_ptr)&p_Var4[1]._M_parent)
      {
        SVar6 = dwarf::RangeListEncodingString((uint)*(byte *)&p_Var4->_M_parent);
        if (uVar5 <= SVar6.Length) {
          uVar5 = SVar6.Length;
        }
      }
    }
  }
  else {
    uVar5 = 0;
  }
  local_78 = 0;
  local_40 = &(local_38->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (local_48 = (local_38->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_48 != local_40; local_48 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48)) {
    pRVar2 = (RangeListEntry *)local_48[1]._M_left;
    for (this_01 = (RangeListEntry *)local_48[1]._M_parent; this_01 != pRVar2; this_01 = this_01 + 1
        ) {
      CurrentBase = (uint64_t)local_58;
      iStack_68 = local_60;
      LookupPooledAddress_00.callable = local_60;
      LookupPooledAddress_00.callback = local_58;
      RangeListEntry::dump
                (this_01,local_50,(local_38->Header).HeaderData.AddrSize,(uint8_t)uVar5,&local_78,
                 DumpOpts,LookupPooledAddress_00);
    }
  }
  return;
}

Assistant:

void DWARFListTableBase<DWARFListType>::dump(
    raw_ostream &OS,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress,
    DIDumpOptions DumpOpts) const {
  Header.dump(OS, DumpOpts);
  OS << HeaderString << "\n";

  // Determine the length of the longest encoding string we have in the table,
  // so we can align the output properly. We only need this in verbose mode.
  size_t MaxEncodingStringLength = 0;
  if (DumpOpts.Verbose) {
    for (const auto &List : ListMap)
      for (const auto &Entry : List.second.getEntries())
        MaxEncodingStringLength =
            std::max(MaxEncodingStringLength,
                     dwarf::RangeListEncodingString(Entry.EntryKind).size());
  }

  uint64_t CurrentBase = 0;
  for (const auto &List : ListMap)
    for (const auto &Entry : List.second.getEntries())
      Entry.dump(OS, getAddrSize(), MaxEncodingStringLength, CurrentBase,
                 DumpOpts, LookupPooledAddress);
}